

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void AddScore(VP8ModeScore *dst,VP8ModeScore *src)

{
  VP8ModeScore *src_local;
  VP8ModeScore *dst_local;
  
  dst->D = src->D + dst->D;
  dst->SD = src->SD + dst->SD;
  dst->R = src->R + dst->R;
  dst->H = src->H + dst->H;
  dst->nz = src->nz | dst->nz;
  dst->score = src->score + dst->score;
  return;
}

Assistant:

static void AddScore(VP8ModeScore* WEBP_RESTRICT const dst,
                     const VP8ModeScore* WEBP_RESTRICT const src) {
  dst->D  += src->D;
  dst->SD += src->SD;
  dst->R  += src->R;
  dst->H  += src->H;
  dst->nz |= src->nz;     // here, new nz bits are accumulated.
  dst->score += src->score;
}